

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O3

Cavs * Omega_h::unmap_cavs(Cavs *__return_storage_ptr__,LOs *a2b,Cavs *c)

{
  int *piVar1;
  Alloc *pAVar2;
  Graph *pGVar3;
  undefined7 uVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  Cavs *pCVar4;
  Cavs *extraout_RAX;
  LOs local_78;
  LOs local_68;
  Graph local_58;
  Graph local_38;
  
  local_68.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68.write_.shared_alloc_.alloc =
           (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.write_.shared_alloc_.alloc)->use_count =
           (local_68.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
  local_38.a2ab.write_.shared_alloc_.alloc = (c->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_38.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_38.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_38.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_38.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38.a2ab.write_.shared_alloc_.direct_ptr =
       (c->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
  local_38.ab2b.write_.shared_alloc_.alloc = (c->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_38.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_38.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_38.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_38.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38.ab2b.write_.shared_alloc_.direct_ptr =
       (c->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
  unmap_graph(&__return_storage_ptr__->keys2old_elems,&local_68,&local_38);
  local_78.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78.write_.shared_alloc_.alloc =
           (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.write_.shared_alloc_.alloc)->use_count =
           (local_78.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
  local_58.a2ab.write_.shared_alloc_.alloc = (c->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_58.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_58.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.a2ab.write_.shared_alloc_.direct_ptr =
       (c->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
  local_58.ab2b.write_.shared_alloc_.alloc = (c->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_58.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_58.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.ab2b.write_.shared_alloc_.direct_ptr =
       (c->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
  pGVar3 = unmap_graph(&__return_storage_ptr__->keys2new_elems,&local_78,&local_58);
  pAVar2 = local_58.ab2b.write_.shared_alloc_.alloc;
  uVar5 = (undefined7)((ulong)pGVar3 >> 8);
  if (((ulong)local_58.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_58.ab2b.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.ab2b.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      uVar5 = extraout_var;
    }
  }
  pAVar2 = local_58.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_58.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_58.a2ab.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.a2ab.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      uVar5 = extraout_var_00;
    }
  }
  pAVar2 = local_78.write_.shared_alloc_.alloc;
  if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      uVar5 = extraout_var_01;
    }
  }
  pAVar2 = local_38.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_38.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_38.ab2b.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.ab2b.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      uVar5 = extraout_var_02;
    }
  }
  pAVar2 = local_38.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_38.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_38.a2ab.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.a2ab.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      uVar5 = extraout_var_03;
    }
  }
  pAVar2 = local_68.write_.shared_alloc_.alloc;
  pCVar4 = (Cavs *)CONCAT71(uVar5,local_68.write_.shared_alloc_.alloc == (Alloc *)0x0);
  if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pCVar4 = extraout_RAX;
    }
  }
  return pCVar4;
}

Assistant:

static Cavs unmap_cavs(LOs a2b, Cavs c) {
  return {
      unmap_graph(a2b, c.keys2old_elems), unmap_graph(a2b, c.keys2new_elems)};
}